

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O3

void test_read_at_least_no_buffered_stream(void)

{
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  uint8_t buffer [40];
  cio_read_buffer rb;
  uint8_t auStack_68 [40];
  uint8_t local_40 [8];
  cio_read_buffer local_38;
  
  ms = (memory_stream *)malloc(0x100);
  iVar1 = memory_stream_init(ms,"Hello");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x26e,UNITY_DISPLAY_STYLE_INT);
  local_38.end = local_40;
  local_38.data = auStack_68;
  local_38.add_ptr = auStack_68;
  local_38.fetch_ptr = auStack_68;
  UnityAssertEqualNumber
            (0,0,"Read buffer was not initialized correctly!",0x273,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_init((cio_buffered_stream *)(ms + 1),(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x276,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_at_least
                    ((cio_buffered_stream *)0x0,&local_38,0x28,dummy_read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (-0x16,(long)cVar2,"Return value not correct!",0x278,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x279,
             UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_close((cio_buffered_stream *)(ms + 1));
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x27c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x27d,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_read_at_least_no_buffered_stream(void)
{
	struct client *client = malloc(sizeof(*client));

	static const char *test_data = "Hello";
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");

	uint8_t buffer[40];
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_read_at_least(NULL, &rb, sizeof(buffer), dummy_read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, dummy_read_handler_fake.call_count, "Handler was not called!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
}